

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

void __thiscall
estl::
vector_s<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_30UL>
::push_back(vector_s<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_30UL>
            *this,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *value)

{
  pointer pvVar1;
  size_type sVar2;
  size_type sVar3;
  range_error *this_00;
  pointer insert_ptr;
  size_type new_size;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *value_local;
  vector_s<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_30UL>
  *this_local;
  
  sVar2 = size(this);
  sVar3 = capacity(this);
  if (sVar3 < sVar2 + 1) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"cas::vector_s push_back beyond capacity.");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  pvVar1 = this->data_ptr_;
  sVar3 = size(this);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair(pvVar1 + sVar3,value);
  this->size_ = sVar2 + 1;
  return;
}

Assistant:

void push_back (T&& value)
    {
        const auto new_size = size() + 1;
        if (new_size > capacity()) {
            ESTL_THROW(std::range_error, "cas::vector_s push_back beyond capacity.");
        }
        const pointer insert_ptr = data_ptr_ + size();
        new (insert_ptr) value_type{std::move(value)};
        size_ = new_size;
    }